

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O0

void __thiscall rcg::ImageList::removeOld(ImageList *this,uint64_t timestamp)

{
  __normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
  *p_Var1;
  element_type *this_00;
  uint64_t uVar2;
  ulong in_RSI;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  *in_RDI;
  size_t i;
  vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  *in_stack_ffffffffffffffa8;
  pointer *this_01;
  __normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
  *this_02;
  iterator in_stack_ffffffffffffffc8;
  __normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
  *local_18;
  
  local_18 = (__normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
              *)0x0;
  while (this_02 = local_18,
        p_Var1 = (__normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                  *)std::
                    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                    ::size((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                            *)&(in_RDI->
                               super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish), this_02 < p_Var1) {
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                *)&(in_RDI->
                   super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(size_type)local_18);
    this_00 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16a0b5);
    uVar2 = Image::getTimestampNS(this_00);
    if (in_RSI < uVar2) {
      local_18 = (__normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                  *)((long)&local_18->_M_current + 1);
    }
    else {
      this_01 = &(in_RDI->
                 super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ::begin(in_stack_ffffffffffffffa8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
      ::operator+(this_02,(difference_type)this_01);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<rcg::Image_const>const*,std::vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>>
      ::__normal_iterator<std::shared_ptr<rcg::Image_const>*>
                ((__normal_iterator<const_std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                  *)this_01,
                 (__normal_iterator<std::shared_ptr<const_rcg::Image>_*,_std::vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>_>
                  *)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffc8 =
           std::
           vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
           ::erase(in_RDI,(const_iterator)in_stack_ffffffffffffffc8._M_current);
    }
  }
  return;
}

Assistant:

void ImageList::removeOld(uint64_t timestamp)
{
  size_t i=0;

  while (i < list.size())
  {
    if (list[i]->getTimestampNS() <= timestamp)
    {
      list.erase(list.begin()+static_cast<int>(i));
    }
    else
    {
      i++;
    }
  }
}